

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsd.c
# Opt level: O0

_Bool tsd_local_slow(tsd_t *tsd)

{
  bool local_59;
  tsd_t *tsd_local;
  uint8_t state_1;
  uint8_t state;
  
  local_59 = true;
  if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled & 1U) != 0) {
    local_59 = '\0' < tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
  }
  return local_59;
}

Assistant:

static bool
tsd_local_slow(tsd_t *tsd) {
	return !tsd_tcache_enabled_get(tsd)
	    || tsd_reentrancy_level_get(tsd) > 0;
}